

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# web_connection_base.cpp
# Opt level: O0

void __thiscall
libtorrent::web_connection_base::web_connection_base
          (web_connection_base *this,peer_connection_args *pack,web_seed_t *web)

{
  bool bVar1;
  ulong uVar2;
  string local_150;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_130;
  string local_108;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e8;
  undefined1 local_60 [8];
  error_code ec;
  string protocol;
  web_seed_t *web_local;
  peer_connection_args *pack_local;
  web_connection_base *this_local;
  
  peer_connection::peer_connection(&this->super_peer_connection,pack);
  (this->super_peer_connection).super_bandwidth_socket._vptr_bandwidth_socket =
       (_func_int **)&PTR_assign_bandwidth_0098fd18;
  (this->super_peer_connection).super_disk_observer._vptr_disk_observer =
       (_func_int **)&DAT_0098fee0;
  (this->super_peer_connection).super_peer_connection_interface._vptr_peer_connection_interface =
       (_func_int **)&PTR_remote_0098fef8;
  (this->super_peer_connection).super_error_handler_interface._vptr_error_handler_interface =
       (_func_int **)&PTR_on_exception_0098ff90;
  (this->super_peer_connection).field_0x764 = 1;
  (this->super_peer_connection).field_0x765 = 0;
  std::deque<libtorrent::peer_request,_std::allocator<libtorrent::peer_request>_>::deque
            (&this->m_requests);
  std::__cxx11::string::string((string *)&this->m_server_string);
  std::__cxx11::string::string((string *)&this->m_basic_auth);
  std::__cxx11::string::string((string *)&this->m_host);
  std::__cxx11::string::string((string *)&this->m_path);
  std::__cxx11::string::string
            ((string *)&this->m_external_auth,(string *)&(web->super_web_seed_entry).auth);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector(&this->m_extra_headers,&(web->super_web_seed_entry).extra_headers);
  http_parser::http_parser(&this->m_parser,1);
  this->m_body_start = 0;
  std::__cxx11::string::string((string *)&ec.cat_);
  boost::system::error_code::error_code((error_code *)local_60);
  std::__cxx11::string::string((string *)&local_108,(string *)web);
  parse_url_components(&local_e8,&local_108,(error_code *)local_60);
  std::tie<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,int,std::__cxx11::string>
            (&local_130,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ec.cat_,
             &this->m_basic_auth,&this->m_host,&this->m_port,&this->m_path);
  std::
  tuple<std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&,int&,std::__cxx11::string&>
  ::operator=((tuple<std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&,int&,std::__cxx11::string&>
               *)&local_130,&local_e8);
  std::
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~tuple(&local_e8);
  std::__cxx11::string::~string((string *)&local_108);
  if ((this->m_port == -1) &&
     (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &ec.cat_,"http"), bVar1)) {
    this->m_port = 0x50;
  }
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &ec.cat_,"https");
  if ((bVar1) && ((this->super_peer_connection).field_0x765 = 1, this->m_port == -1)) {
    this->m_port = 0x1bb;
  }
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    base64encode(&local_150,&this->m_basic_auth);
    std::__cxx11::string::operator=((string *)&this->m_basic_auth,(string *)&local_150);
    std::__cxx11::string::~string((string *)&local_150);
  }
  std::__cxx11::string::operator=((string *)&this->m_server_string,"URL seed @ ");
  std::__cxx11::string::operator+=((string *)&this->m_server_string,(string *)&this->m_host);
  std::__cxx11::string::~string((string *)&ec.cat_);
  return;
}

Assistant:

web_connection_base::web_connection_base(
		peer_connection_args const& pack
		, web_seed_t& web)
		: peer_connection(pack)
		, m_first_request(true)
		, m_ssl(false)
		, m_external_auth(web.auth)
		, m_extra_headers(web.extra_headers)
		, m_parser(http_parser::dont_parse_chunks)
		, m_body_start(0)
	{
		TORRENT_ASSERT(&web.peer_info == pack.peerinfo);
		// when going through a proxy, we don't necessarily have an endpoint here,
		// since the proxy might be resolving the hostname, not us
		TORRENT_ASSERT(web.endpoints.empty() || web.endpoints.front() == pack.endp);

		INVARIANT_CHECK;

		TORRENT_ASSERT(is_outgoing());

		TORRENT_ASSERT(!m_torrent.lock()->is_upload_only());

		// we only want left-over bandwidth
		// TODO: introduce a web-seed default class which has a low download priority

		std::string protocol;
		error_code ec;
		std::tie(protocol, m_basic_auth, m_host, m_port, m_path)
			= parse_url_components(web.url, ec);
		TORRENT_ASSERT(!ec);

		if (m_port == -1 && protocol == "http")
			m_port = 80;

#ifdef TORRENT_USE_OPENSSL
		if (protocol == "https")
		{
			m_ssl = true;
			if (m_port == -1) m_port = 443;
		}
#endif

		if (!m_basic_auth.empty())
			m_basic_auth = base64encode(m_basic_auth);

		m_server_string = "URL seed @ ";
		m_server_string += m_host;
	}